

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::ProgramPipelines::FunctionalTest::prepareShaderPrograms
          (FunctionalTest *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  undefined4 *puVar5;
  TestContext *pTVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  MessageBuilder local_2350;
  undefined4 local_21cc;
  char local_21c8 [4];
  GLsizei log_size_1;
  GLchar log_1 [4096];
  MessageBuilder local_11b0;
  undefined4 local_102c;
  char local_1028 [4];
  GLsizei log_size;
  GLchar log [4096];
  int local_1c;
  long lStack_18;
  GLint status;
  Functions *gl;
  FunctionalTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  if ((this->m_spo_v != 0) || (this->m_spo_f != 0)) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  GVar2 = (**(code **)(lStack_18 + 0x3f8))(0x8b31,1,&s_vertex_shader);
  this->m_spo_v = GVar2;
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glCreateShaderProgramv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                  ,0x27e);
  local_1c = 1;
  (**(code **)(lStack_18 + 0x9d8))(this->m_spo_v,0x8b83,&local_1c);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                  ,0x283);
  if (local_1c == 0) {
    memset(local_1028,0,0x1000);
    local_102c = 0;
    (**(code **)(lStack_18 + 0x988))(this->m_spo_v,0x1000,&local_102c,local_1028);
    dVar3 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar3,"glGetProgramInfoLog call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                    ,0x28e);
    pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar7 = tcu::TestContext::getLog(pTVar6);
    tcu::TestLog::operator<<(&local_11b0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_11b0,
                        (char (*) [49])"Vertex shader program building failed with log: ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4096])local_1028);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_11b0);
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  GVar2 = (**(code **)(lStack_18 + 0x3f8))(0x8b30,1,&s_fragment_shader);
  this->m_spo_f = GVar2;
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glCreateShaderProgramv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                  ,0x298);
  local_1c = 1;
  (**(code **)(lStack_18 + 0x9d8))(this->m_spo_f,0x8b83,&local_1c);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                  ,0x29d);
  if (local_1c == 0) {
    memset(local_21c8,0,0x1000);
    local_21cc = 0;
    (**(code **)(lStack_18 + 0x988))(this->m_spo_f,0x1000,&local_21cc,local_21c8);
    dVar3 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar3,"glGetProgramInfoLog call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                    ,0x2a8);
    pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar7 = tcu::TestContext::getLog(pTVar6);
    tcu::TestLog::operator<<(&local_2350,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_2350,
                        (char (*) [51])"Fragment shader program building failed with log: ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4096])local_21c8);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2350);
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  return;
}

Assistant:

void FunctionalTest::prepareShaderPrograms()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Log size limit. */
	static const glw::GLsizei max_log_size = 4096;

	/* Sanity check. */
	if (m_spo_v || m_spo_f)
	{
		throw 0;
	}

	/* Create Vertex Shader Program. */
	m_spo_v = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, &s_vertex_shader);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv call failed.");

	glw::GLint status = GL_TRUE;

	gl.getProgramiv(m_spo_v, GL_VALIDATE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

	if (GL_FALSE == status)
	{
		/* Storage for data. */
		glw::GLchar log[max_log_size] = { 0 };

		/* Storage fetched length. */
		glw::GLsizei log_size = 0;

		gl.getProgramInfoLog(m_spo_v, max_log_size, &log_size, log);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Vertex shader program building failed with log: " << log
											<< tcu::TestLog::EndMessage;

		throw 0;
	}

	m_spo_f = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, &s_fragment_shader);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv call failed.");

	status = GL_TRUE;

	gl.getProgramiv(m_spo_f, GL_VALIDATE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

	if (GL_FALSE == status)
	{
		/* Storage for data. */
		glw::GLchar log[max_log_size] = { 0 };

		/* Storage fetched length. */
		glw::GLsizei log_size = 0;

		gl.getProgramInfoLog(m_spo_f, max_log_size, &log_size, log);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Fragment shader program building failed with log: " << log
											<< tcu::TestLog::EndMessage;

		throw 0;
	}
}